

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O0

void __thiscall
Mechanization::Mechanization(Mechanization *this,Euler pose,BLH prvBLH,ELLIPSOID type,Output prv)

{
  ELLIPSOID *in_RDI;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff98;
  Matrix<double,_3,_1,_0,_3,_1> *this_00;
  double *y;
  
  y = &pose.yaw;
  this_00 = (Matrix<double,_3,_1,_0,_3,_1> *)&stack0x00000008;
  ELLIPSOID::ELLIPSOID(in_RDI);
  Euler::Euler((Euler *)(in_RDI + 1));
  Euler::Euler((Euler *)&in_RDI[1].alpha);
  BLH::BLH((BLH *)&in_RDI[1].gama_a);
  BLH::BLH((BLH *)(in_RDI + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1c2bf5);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1c2c06);
  Output::Output((Output *)(in_RDI + 3));
  Output::Output((Output *)&in_RDI[3].gama_b);
  in_RDI[1].a = (this_00->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[0];
  in_RDI[1].b = (this_00->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[1];
  in_RDI[1].c = (this_00->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[2];
  in_RDI[1].gama_a = in_stack_00000020;
  in_RDI[1].gama_b = in_stack_00000028;
  in_RDI[1].GM = in_stack_00000030;
  memcpy(in_RDI,&stack0x00000038,0x48);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)0xbfa47ae147ae147b,(Scalar *)0x3fa916872b020c4a,y,
             &in_RDI->a);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=(this_00,in_stack_ffffffffffffff98);
  memcpy(in_RDI + 3,y,0x38);
  return;
}

Assistant:

Mechanization::Mechanization(Euler pose, BLH prvBLH, ELLIPSOID type, Output prv) {
    this->prvPose = pose;
    this->prvPosi = prvBLH;
    this->type = type;
    this->prvVel = Vector3d(-6.360, -0.040, 0.049);
    // this->prvVel = Vector3d::Zero();
    this->prvOut = prv;
}